

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_aux_spi_write(uint16_t data)

{
  uint32_t uVar1;
  uint32_t *paddr;
  uint32_t *paddr_00;
  uint32_t *paddr_01;
  uint32_t _cntl0;
  uint32_t *io;
  uint32_t *stat;
  uint32_t *cntl1;
  uint32_t *cntl0;
  uint16_t data_local;
  
  paddr = bcm2835_spi1 + 1;
  paddr_00 = bcm2835_spi1 + 2;
  paddr_01 = bcm2835_spi1 + 8;
  bcm2835_peri_write(bcm2835_spi1,spi1_speed << 0x14 | 0x60850);
  bcm2835_peri_write(paddr,2);
  do {
    uVar1 = bcm2835_peri_read(paddr_00);
  } while ((uVar1 & 0x400) != 0);
  bcm2835_peri_write(paddr_01,(uint)data << 0x10);
  return;
}

Assistant:

void bcm2835_aux_spi_write(uint16_t data)
{
    volatile uint32_t* cntl0 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL0/4;
    volatile uint32_t* cntl1 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL1/4;
    volatile uint32_t* stat = bcm2835_spi1 + BCM2835_AUX_SPI_STAT/4;
    volatile uint32_t* io = bcm2835_spi1 + BCM2835_AUX_SPI_IO/4;

    uint32_t _cntl0 = (spi1_speed << BCM2835_AUX_SPI_CNTL0_SPEED_SHIFT);
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_CS2_N;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_ENABLE;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_MSBF_OUT;
    _cntl0 |= 16; // Shift length

    bcm2835_peri_write(cntl0, _cntl0);
    bcm2835_peri_write(cntl1, BCM2835_AUX_SPI_CNTL1_MSBF_IN);

    while (bcm2835_peri_read(stat) & BCM2835_AUX_SPI_STAT_TX_FULL)
	;

    bcm2835_peri_write(io, (uint32_t) data << 16);
}